

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switches.cpp
# Opt level: O1

user_options * user_options::get(user_options *__return_storage_ptr__,int argc,tchar **argv)

{
  bool bVar1;
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"pstore prime number generator\n","");
  bVar1 = pstore::command_line::details::
          parse_command_line_options<char*const*,std::ostream,std::ostream>
                    (argv,argv + argc,&local_40,
                     (basic_ostream<char,_std::char_traits<char>_> *)&std::cout,
                     (basic_ostream<char,_std::char_traits<char>_> *)&std::cerr);
  if (bVar1) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
    (__return_storage_ptr__->output)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->output).field_2;
    (__return_storage_ptr__->output)._M_string_length = 0;
    (__return_storage_ptr__->output).field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
    __return_storage_ptr__->endianness = (anonymous_namespace)::endian_opt._136_4_;
    __return_storage_ptr__->maximum = (ulong)(uint)(anonymous_namespace)::maximum_opt._136_4_;
    return __return_storage_ptr__;
  }
  exit(1);
}

Assistant:

user_options user_options::get (int argc, tchar * argv[]) {
    parse_command_line_options (argc, argv, "pstore prime number generator\n");

    user_options result;
    result.output = output_opt.get ();
    result.endianness = endian_opt.get ();
    result.maximum = maximum_opt.get ();
    return result;
}